

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  reference __x;
  iterator __first;
  iterator __last;
  reference piVar2;
  int local_f4;
  iterator iStack_f0;
  int testDependency;
  iterator __end2;
  iterator __begin2;
  TestList *__range2;
  TestList dependencies;
  iterator iStack_b8;
  int test;
  iterator __end1_1;
  iterator __begin1_1;
  TestList *__range1_1;
  TestSet alreadySortedTests;
  pair<const_int,_cmCTestMultiProcessHandler::TestSet> *i;
  iterator __end1;
  iterator __begin1;
  TestMap *__range1;
  TestList presortedList;
  cmCTestMultiProcessHandler *this_local;
  
  presortedList.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)this;
  TestList::TestList((TestList *)&__range1);
  __end1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::begin(&(this->Tests).
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  );
  i = (pair<const_int,_cmCTestMultiProcessHandler::TestSet> *)
      std::
      map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::end(&(this->Tests).
             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           );
  while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
    __x = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
          operator*(&__end1);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&__range1,&__x->first);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&__end1);
  }
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)&__range1);
  __last = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  TestComparator::TestComparator
            ((TestComparator *)
             &alreadySortedTests.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
              super__Rb_tree_header._M_node_count,this);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TestComparator>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             (TestComparator)
             alreadySortedTests.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
             super__Rb_tree_header._M_node_count);
  TestSet::TestSet((TestSet *)&__range1_1);
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&__range1);
  iStack_b8 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff48), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    dependencies.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
    _4_4_ = *piVar2;
    bVar1 = ::cm::contains<cmCTestMultiProcessHandler::TestSet,_int,_0>
                      ((TestSet *)&__range1_1,
                       (int *)((long)&dependencies.super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 4));
    if (!bVar1) {
      TestList::TestList((TestList *)&__range2);
      GetAllTestDependencies
                (this,dependencies.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage._4_4_,(TestList *)&__range2);
      __end2 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range2);
      iStack_f0 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&__range2);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff10), bVar1) {
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2);
        local_f4 = *piVar2;
        bVar1 = ::cm::contains<cmCTestMultiProcessHandler::TestSet,_int,_0>
                          ((TestSet *)&__range1_1,&local_f4);
        if (!bVar1) {
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1_1,&local_f4);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,&local_f4);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1_1,
                 (value_type_conflict2 *)
                 ((long)&dependencies.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<int,_std::allocator<int>_>::push_back
                (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,
                 (value_type_conflict2 *)
                 ((long)&dependencies.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
      TestList::~TestList((TestList *)&__range2);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  TestSet::~TestSet((TestSet *)&__range1_1);
  TestList::~TestList((TestList *)&__range1);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (auto const& i : this->Tests) {
    presortedList.push_back(i.first);
  }

  std::stable_sort(presortedList.begin(), presortedList.end(),
                   TestComparator(this));

  TestSet alreadySortedTests;

  for (int test : presortedList) {
    if (cm::contains(alreadySortedTests, test)) {
      continue;
    }

    TestList dependencies;
    this->GetAllTestDependencies(test, dependencies);

    for (int testDependency : dependencies) {
      if (!cm::contains(alreadySortedTests, testDependency)) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}